

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O1

shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_simple_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload)

{
  long lVar1;
  undefined8 uVar2;
  MiniBusClient *pMVar3;
  error_category *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  long lVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  ulong in_R9;
  bool bVar12;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar13;
  uint32_t rid;
  MiniBusEncoder encoder;
  unique_lock<std::mutex> lock;
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tok;
  result_type local_e4;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  MiniBusClient *local_c0;
  ulong local_b8;
  size_t local_b0;
  char *local_a8;
  int local_a0;
  uint uStack_9c;
  error_category *local_98;
  unique_lock<std::mutex> local_90;
  undefined1 local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  error_code local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  local_b0 = payload._M_len;
  local_a8 = command._M_str;
  sVar10 = command._M_len;
  local_90._M_device = (mutex_type *)(sVar10 + 0x13a8);
  local_90._M_owns = false;
  local_c0 = this;
  local_b8 = in_R9;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  lVar1 = sVar10 + 0x13d8;
  do {
    local_e4 = std::uniform_int_distribution<unsigned_int>::operator()
                         ((uniform_int_distribution<unsigned_int> *)(sVar10 + 0x13a0),
                          (random_device *)(sVar10 + 0x18),(param_type *)(sVar10 + 0x13a0));
    uVar7 = (ulong)local_e4;
    lVar8 = lVar1;
    for (lVar11 = *(long *)(sVar10 + 0x13e0); lVar11 != 0;
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8)) {
      bVar12 = *(ulong *)(lVar11 + 0x20) < uVar7;
      if (!bVar12) {
        lVar8 = lVar11;
      }
    }
    lVar11 = lVar1;
    if ((lVar8 != lVar1) && (lVar11 = lVar8, uVar7 < *(ulong *)(lVar8 + 0x20))) {
      lVar11 = lVar1;
    }
  } while (lVar11 != lVar1);
  local_d8 = (undefined1 *)0x0;
  local_d0 = 0;
  local_80._0_4_ = local_e4;
  local_e0 = &local_d0;
  std::__cxx11::string::append((char *)&local_e0,(ulong)local_80);
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,local_b0);
  std::__cxx11::string::reserve((ulong)&local_e0);
  if ((char *)0x7f < payload._M_str) {
    pcVar9 = payload._M_str;
    do {
      std::__cxx11::string::push_back((char)&local_e0);
      bVar12 = (char *)0x3fff < pcVar9;
      pcVar9 = (char *)((ulong)pcVar9 >> 7);
    } while (bVar12);
  }
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,local_b8);
  local_40._0_8_ = local_d8;
  if (local_d8 != (undefined1 *)0x0) {
    local_40._0_8_ = local_e0;
  }
  local_80 = (undefined1  [8])local_40;
  local_40._8_8_ = local_d8;
  local_a0 = 0;
  uStack_9c = uStack_9c & 0xffffff00;
  local_98 = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (sVar10 + 0x1460);
  peVar4 = local_98;
  if ((char)uStack_9c == '\x01') {
    uVar2._4_4_ = uStack_9c;
    uVar2._0_4_ = local_a0;
    std::runtime_error::runtime_error((runtime_error *)local_80,"write");
    local_60._M_p = (pointer)&local_50;
    local_80 = (undefined1  [8])&PTR__system_error_0011eb10;
    local_70.cat_ = peVar4;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    local_70._0_8_ = uVar2;
    boost::throw_exception<boost::system::system_error>((system_error *)local_80);
  }
  local_80 = (undefined1  [8])0x0;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa8);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011f5d8;
  memset((element_type *)(p_Var6 + 1),0,0x98);
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NotifyToken_0011f490;
  p_Var6[1]._M_use_count = 0;
  p_Var6[1]._M_weak_count = 0;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var6[2]._M_use_count = 0;
  p_Var6[2]._M_weak_count = 0;
  p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var6[3]._M_use_count = 0;
  p_Var6[3]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)(p_Var6 + 4));
  *(undefined1 *)&p_Var6[9]._M_use_count = 0;
  p_Var6[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_80 = (undefined1  [8])(p_Var6 + 1);
  local_78._M_pi = p_Var6;
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>&>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)(sVar10 + 0x13d0),&local_e4,
             (shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80);
  _Var5._M_pi = local_78._M_pi;
  pMVar3 = local_c0;
  local_c0->is_running = local_80;
  (local_c0->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_c0->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var5._M_pi;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  sVar13.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar13.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pMVar3;
  return (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar13.
           super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::optional<std::string>>>
  send_simple(std::string_view command, std::string_view payload = {}) {
    std::unique_lock lock{mtx};
    auto rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<NotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }